

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<4,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  reference __x;
  int *piVar4;
  double *pdVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pdVar8;
  double local_118;
  double dx_1;
  iterator __end10;
  iterator __begin10;
  vector<double,_std::allocator<double>_> *__range10;
  int p;
  int current;
  double dx;
  iterator __end7;
  iterator __begin7;
  vector<double,_std::allocator<double>_> *__range7;
  int *r;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> basis_derivative;
  double basis_value;
  undefined1 local_80 [6];
  bool isSupported;
  vector<int,_std::allocator<int>_> monkey_tail;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  double *y_local;
  vector<double,_std::allocator<double>_> *svals_local;
  vector<int,_std::allocator<int>_> *sindx_local;
  double *x_local;
  MultiIndexSet *work_local;
  GridLocalPolynomial *this_local;
  
  iVar1 = this->top_level;
  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)y;
  ::std::allocator<int>::allocator(&local_51);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)(iVar1 + 1),&local_51);
  ::std::allocator<int>::~allocator(&local_51);
  iVar1 = this->top_level;
  ::std::allocator<int>::allocator((allocator<int> *)((long)&basis_value + 7));
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)(iVar1 + 1),
             (allocator<int> *)((long)&basis_value + 7));
  ::std::allocator<int>::~allocator((allocator<int> *)((long)&basis_value + 7));
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::allocator<double>::allocator((allocator<double> *)((long)&__range2 + 7));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,(long)iVar1,
             (allocator<double> *)((long)&__range2 + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&__range2 + 7));
  __end2._M_current =
       (int *)::std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&this->roots);
  r = (int *)::std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&this->roots);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&r), bVar3) {
    __x = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator*(&__end2);
    piVar4 = MultiIndexSet::getIndex(work,*__x);
    pdVar5 = ::std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_a8);
    diffBasisSupported<(TasGrid::RuleLocal::erule)2>
              (this,piVar4,x,pdVar5,(bool *)((long)&basis_value + 6));
    if ((basis_value._6_1_ & 1) != 0) {
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)sindx,__x);
      __end7._M_current =
           (double *)
           ::std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_a8);
      dx = (double)::std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)local_a8);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end7,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)&dx), bVar3) {
        pdVar8 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end7);
        _p = *pdVar8;
        ::std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)svals,(value_type_conflict2 *)&p);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&__end7);
      }
      __range10._4_4_ = 0;
      iVar1 = *__x;
      pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_80,0);
      *pvVar6 = iVar1;
      pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)*__x);
      vVar2 = *pvVar7;
      pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,0);
      *pvVar6 = vVar2;
      while( true ) {
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,0);
        iVar1 = *pvVar6;
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,0);
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)(*pvVar6 + 1));
        if (*pvVar7 <= iVar1) break;
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)__range10._4_4_);
        iVar1 = *pvVar6;
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)__range10._4_4_);
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)(*pvVar6 + 1));
        if (iVar1 < *pvVar7) {
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_50,(long)__range10._4_4_);
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&this->indx,(long)*pvVar6);
          __range10._0_4_ = *pvVar7;
          piVar4 = MultiIndexSet::getIndex(work,(int)__range10);
          pdVar5 = ::std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)local_a8);
          diffBasisSupported<(TasGrid::RuleLocal::erule)2>
                    (this,piVar4,x,pdVar5,(bool *)((long)&basis_value + 6));
          if ((basis_value._6_1_ & 1) == 0) {
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,(long)__range10._4_4_)
            ;
            *pvVar6 = *pvVar6 + 1;
          }
          else {
            ::std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)sindx,(value_type_conflict3 *)&__range10
                      );
            __end10._M_current =
                 (double *)
                 ::std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_a8);
            dx_1 = (double)::std::vector<double,_std::allocator<double>_>::end
                                     ((vector<double,_std::allocator<double>_> *)local_a8);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end10,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                                *)&dx_1), iVar1 = (int)__range10, bVar3) {
              pdVar8 = __gnu_cxx::
                       __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                       operator*(&__end10);
              local_118 = *pdVar8;
              ::std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)svals,&local_118);
              __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator++(&__end10);
            }
            __range10._4_4_ = __range10._4_4_ + 1;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_80,(long)__range10._4_4_)
            ;
            *pvVar6 = iVar1;
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&this->pntr,
                                (long)(int)__range10);
            vVar2 = *pvVar7;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,(long)__range10._4_4_)
            ;
            *pvVar6 = vVar2;
          }
        }
        else {
          __range10._4_4_ = __range10._4_4_ + -1;
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_50,(long)__range10._4_4_);
          *pvVar6 = *pvVar6 + 1;
        }
      }
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a8);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }